

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void skip_nl(c2m_ctx_t c2m_ctx,token_t t,VARR_token_t *buffer)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  MIR_error_func_t p_Var4;
  uint *puVar5;
  gen_ctx *pgVar6;
  VARR_token_t *pVVar7;
  pre_ctx *ppVar8;
  macro_t pmVar9;
  VARR_macro_call_t *pVVar10;
  VARR_char *pVVar11;
  token_t *pptVar12;
  pos_t pVar13;
  char *pcVar14;
  MIR_item_t pMVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  token_t ptVar19;
  token_t *pptVar20;
  long lVar21;
  c2m_ctx_t pcVar22;
  MIR_context_t pMVar23;
  token_t ptVar24;
  macro_call_t pmVar25;
  VARR_token_arr_t *pVVar26;
  ulong *puVar27;
  void *pvVar28;
  c2m_ctx_t pcVar29;
  token_arr_t pVVar30;
  token_arr_t *ppVVar31;
  macro_call_t *__ptr;
  node_t_conflict pnVar32;
  long *plVar33;
  undefined8 *puVar34;
  MIR_context_t pMVar35;
  MIR_context_t pMVar36;
  undefined1 *puVar37;
  uint uVar38;
  token_t t_00;
  ulong uVar39;
  char *format;
  long extraout_RDX;
  VARR_char *pVVar40;
  c2m_ctx_t pcVar41;
  c2m_ctx_t pcVar42;
  c2m_ctx_t pcVar43;
  c2m_ctx_t pcVar44;
  char *pcVar45;
  char **in_R8;
  size_t sVar46;
  token_t t_01;
  MIR_context_t pMVar47;
  c2m_ctx_t pcVar48;
  char cVar49;
  ulong uVar50;
  MIR_context_t pMVar51;
  c2m_ctx_t pcVar52;
  c2m_ctx_t pcVar53;
  size_t sVar54;
  c2mir_options *pcVar55;
  bool bVar56;
  bool bVar57;
  str_t sVar58;
  MIR_context_t pMStack_128;
  MIR_context_t pMStack_110;
  MIR_context_t pMStack_108;
  c2m_ctx_t pcStack_f0;
  uint uStack_94;
  
  pcVar42 = c2m_ctx;
  ptVar19 = t;
  if (t != (token_t)0x0) goto LAB_00190cc1;
  while( true ) {
    do {
      t = (token_t)0x0;
      pcVar42 = c2m_ctx;
      ptVar19 = get_next_pptoken_1(c2m_ctx,0);
LAB_00190cc1:
      if ((*(short *)ptVar19 == 10) || (*(short *)ptVar19 == 0x147)) {
        unget_next_pptoken((c2m_ctx_t)c2m_ctx->buffered_tokens,ptVar19);
        return;
      }
    } while (buffer == (VARR_token_t *)0x0);
    pptVar20 = buffer->varr;
    if (pptVar20 == (token_t *)0x0) break;
    sVar46 = buffer->els_num;
    uVar50 = sVar46 + 1;
    if (buffer->size < uVar50) {
      sVar46 = (uVar50 >> 1) + uVar50;
      pptVar20 = (token_t *)realloc(pptVar20,sVar46 * 8);
      buffer->varr = pptVar20;
      buffer->size = sVar46;
      sVar46 = buffer->els_num;
      uVar50 = sVar46 + 1;
    }
    buffer->els_num = uVar50;
    pptVar20[sVar46] = ptVar19;
  }
  skip_nl_cold_1();
  if (((pcVar42 != (c2m_ctx_t)0x0) && (lVar3 = pcVar42->env[0].__jmpbuf[0], lVar3 != 0)) &&
     (pMVar36 = pcVar42->ctx, pMVar36 != (MIR_context_t)0x0)) {
    pcVar42->ctx = (MIR_context_t)((long)&pMVar36[-1].wrapper_end_addr + 7);
    pmVar25 = *(macro_call_t *)(lVar3 + -8 + (long)pMVar36 * 8);
    pmVar25->macro->ignore_p = 0;
    free_macro_call(pmVar25);
    return;
  }
  pop_macro_call_cold_1();
  pMVar36 = ((c2m_ctx_t)t)->ctx;
  p_Var4 = pMVar36->error_func;
  pcVar29 = (c2m_ctx_t)t;
  pcVar43 = pcVar42;
  if (p_Var4 != (MIR_error_func_t)0x0) {
    iVar17 = *(int *)p_Var4;
    iVar18 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
    if (iVar18 < iVar17) {
      lVar3 = *(long *)(p_Var4 + 0x10);
      uStack_94 = 0xffffffff;
      pcVar44 = (c2m_ctx_t)t;
      do {
        *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2) = iVar18 + 1;
        ptVar19 = *(token_t *)(lVar3 + (long)iVar18 * 8);
        sVar1 = *(short *)ptVar19;
        if (sVar1 == 0x103) {
          pcVar43 = (c2m_ctx_t)pMVar36->c2mir_ctx;
          pcVar44 = (c2m_ctx_t)ptVar19->repr;
          uVar16 = find_param((VARR_token_t *)pcVar43,(char *)pcVar44);
          if ((int)uVar16 < 0) goto LAB_00190f61;
          puVar27 = (ulong *)((c2m_ctx_t)t)->env[0].__jmpbuf[1];
          if (((puVar27 == (ulong *)0x0) || (puVar27[2] == 0)) || (*puVar27 <= (ulong)uVar16)) {
LAB_001915b8:
            process_replacement_cold_18();
LAB_001915bd:
            process_replacement_cold_9();
LAB_001915c2:
            process_replacement_cold_10();
LAB_001915c7:
            process_replacement_cold_3();
            pcVar29 = pcVar44;
LAB_001915cc:
            pcVar44 = pcVar29;
            process_replacement_cold_7();
LAB_001915d1:
            process_replacement_cold_12();
LAB_001915d6:
            process_replacement_cold_2();
LAB_001915db:
            process_replacement_cold_8();
            pcVar29 = pcVar44;
            goto LAB_001915e0;
          }
          pcVar44 = *(c2m_ctx_t *)(puVar27[2] + (ulong)uVar16 * 8);
          if (-1 < (int)uStack_94) {
            pcVar29 = (c2m_ctx_t)(ulong)uStack_94;
            del_tokens((VARR_token_t *)((c2m_ctx_t)t)->env[0].__jmpbuf[3],uStack_94,-1);
            pcVar43 = pcVar44;
            if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_001915f9;
            pMVar23 = pcVar44->ctx;
            if (pMVar23 == (MIR_context_t)0x0) {
LAB_0019101d:
              pMVar35 = ((c2m_ctx_t)t)->ctx;
            }
            else {
              pptVar20 = (token_t *)pcVar44->env[0].__jmpbuf[0];
              if (pptVar20 == (token_t *)0x0) goto LAB_00191603;
              sVar1 = *(short *)*pptVar20;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar29 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar44,0,1);
                pMVar23 = pcVar44->ctx;
                if (pMVar23 == (MIR_context_t)0x0) goto LAB_0019101d;
              }
              pMVar35 = (MIR_context_t)pcVar44->env[0].__jmpbuf[0];
              if (pMVar35 == (MIR_context_t)0x0) goto LAB_0019160d;
              sVar1 = (short)(&pMVar35->temp_data)[(long)&pMVar23[-1].wrapper_end_addr]->els_num;
              if (((sVar1 == 10) || (sVar1 == 0x20)) &&
                 (pMVar23 = (MIR_context_t)((long)&pMVar23[-1].wrapper_end_addr + 7),
                 pcVar44->ctx = pMVar23, pMVar23 == (MIR_context_t)0x0)) goto LAB_0019101d;
            }
            pgVar6 = pMVar35->gen_ctx;
            pcVar45 = (pcVar42->empty_str).s;
            sVar46 = (pcVar42->empty_str).len;
            pVar13 = *(pos_t *)&pgVar6->optimize_level;
            pnVar32 = new_node(pcVar42,N_STR);
            add_pos(pcVar42,pnVar32,pVar13);
            (pnVar32->u).s.s = pcVar45;
            (pnVar32->u).s.len = sVar46;
            pcVar14 = ((pos_t *)&pgVar6->optimize_level)->fname;
            pMVar15 = pgVar6->curr_func_item;
            sVar58 = uniq_cstr(pcVar42,"");
            pcVar45 = sVar58.s;
            pcVar29 = (c2m_ctx_t)0x30;
            pcVar43 = pcVar42;
            pcVar22 = (c2m_ctx_t)reg_malloc(pcVar42,0x30);
            *(undefined4 *)&pcVar22->ctx = 0x102;
            ((pos_t *)&pcVar22->options)->fname = pcVar14;
            pcVar22->env[0].__jmpbuf[0] = (long)pMVar15;
            pcVar22->env[0].__jmpbuf[3] = (long)pcVar45;
            *(undefined4 *)(pcVar22->env[0].__jmpbuf + 1) = 0;
            pcVar22->env[0].__jmpbuf[2] = (long)pnVar32;
            pVVar40 = pcVar42->temp_string;
            if ((pVVar40 != (VARR_char *)0x0) &&
               (pcVar53 = (c2m_ctx_t)pVVar40->varr, pcVar53 != (c2m_ctx_t)0x0)) {
              pVVar40->els_num = 0;
              cVar49 = *pcVar45;
              if (cVar49 == '\0') {
                uVar50 = 1;
                sVar46 = 0;
              }
              else {
                do {
                  pcVar45 = pcVar45 + 1;
                  pVVar40 = pcVar42->temp_string;
                  pcVar53 = (c2m_ctx_t)pVVar40->varr;
                  if (pcVar53 == (c2m_ctx_t)0x0) goto LAB_001915cc;
                  sVar46 = pVVar40->els_num;
                  uVar50 = sVar46 + 1;
                  if (pVVar40->size < uVar50) {
                    pcVar41 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
                    pcVar29 = pcVar41;
                    pcVar43 = pcVar53;
                    pcVar53 = (c2m_ctx_t)realloc(pcVar53,(size_t)pcVar41);
                    pVVar40->varr = (char *)pcVar53;
                    pVVar40->size = (size_t)pcVar41;
                    sVar46 = pVVar40->els_num;
                    uVar50 = sVar46 + 1;
                  }
                  pVVar40->els_num = uVar50;
                  *(char *)((long)pcVar53->env[0].__jmpbuf + (sVar46 - 0x10)) = cVar49;
                  cVar49 = *pcVar45;
                } while (cVar49 != '\0');
                pVVar40 = pcVar42->temp_string;
                pcVar53 = (c2m_ctx_t)pVVar40->varr;
                if (pcVar53 == (c2m_ctx_t)0x0) goto LAB_00191608;
                sVar46 = pVVar40->els_num;
                uVar50 = sVar46 + 1;
              }
              if (pVVar40->size < uVar50) {
                sVar54 = (uVar50 >> 1) + uVar50;
                pcVar43 = pcVar53;
                pcVar53 = (c2m_ctx_t)realloc(pcVar53,sVar54);
                pVVar40->varr = (char *)pcVar53;
                pVVar40->size = sVar54;
                sVar46 = pVVar40->els_num;
                uVar50 = sVar46 + 1;
              }
              pVVar40->els_num = uVar50;
              *(undefined1 *)((long)pcVar53->env[0].__jmpbuf + (sVar46 - 0x10)) = 0x22;
              if (pcVar44->ctx != (MIR_context_t)0x0) {
                pMVar23 = (MIR_context_t)0x0;
                do {
                  pptVar20 = (token_t *)pcVar44->env[0].__jmpbuf[0];
                  if (pptVar20 == (token_t *)0x0) goto LAB_001915d1;
                  ptVar19 = pptVar20[(long)pMVar23];
                  sVar1 = *(short *)ptVar19;
                  if ((sVar1 == 0x20) || (sVar1 == 10)) {
                    pVVar40 = pcVar42->temp_string;
                    pcVar29 = (c2m_ctx_t)pVVar40->varr;
                    if (pcVar29 == (c2m_ctx_t)0x0) goto LAB_001915db;
                    sVar46 = pVVar40->els_num;
                    uVar50 = sVar46 + 1;
                    if (pVVar40->size < uVar50) {
                      sVar54 = (uVar50 >> 1) + uVar50;
                      pcVar43 = pcVar29;
                      pcVar29 = (c2m_ctx_t)realloc(pcVar29,sVar54);
                      pVVar40->varr = (char *)pcVar29;
                      pVVar40->size = sVar54;
                      sVar46 = pVVar40->els_num;
                      uVar50 = sVar46 + 1;
                    }
                    pVVar40->els_num = uVar50;
                    *(undefined1 *)((long)pcVar29->env[0].__jmpbuf + (sVar46 - 0x10)) = 0x20;
                  }
                  else {
                    pcVar45 = ptVar19->repr;
                    cVar49 = *pcVar45;
                    if (cVar49 != '\0') {
                      pMVar35 = (MIR_context_t)((long)&pMVar23->gen_ctx + 1);
                      do {
                        uVar16 = 0;
                        if (pcVar44->ctx != pMVar35) {
                          if ((pcVar44->ctx <= pMVar35) ||
                             (pptVar20 = (token_t *)pcVar44->env[0].__jmpbuf[0],
                             pptVar20 == (token_t *)0x0)) goto LAB_001915bd;
                          uVar16 = (uint)*pptVar20[(long)((long)&pMVar23->gen_ctx + 1)]->repr;
                        }
                        if (cVar49 == '\"') {
LAB_001912ac:
                          pVVar40 = pcVar42->temp_string;
                          pcVar29 = (c2m_ctx_t)pVVar40->varr;
                          if (pcVar29 == (c2m_ctx_t)0x0) goto LAB_001915c2;
                          sVar46 = pVVar40->els_num;
                          uVar50 = sVar46 + 1;
                          if (pVVar40->size < uVar50) {
                            sVar54 = (uVar50 >> 1) + uVar50;
                            pcVar43 = pcVar29;
                            pcVar29 = (c2m_ctx_t)realloc(pcVar29,sVar54);
                            pVVar40->varr = (char *)pcVar29;
                            pVVar40->size = sVar54;
                            sVar46 = pVVar40->els_num;
                            uVar50 = sVar46 + 1;
                          }
                          pVVar40->els_num = uVar50;
                          *(undefined1 *)((long)pcVar29->env[0].__jmpbuf + (sVar46 - 0x10)) = 0x5c;
                          cVar49 = *pcVar45;
                        }
                        else if (cVar49 == '\\') {
                          cVar49 = '\\';
                          if (((0x37 < uVar16 - 0x3f) ||
                              ((0xa880cc20000001U >> ((ulong)(uVar16 - 0x3f) & 0x3f) & 1) == 0)) &&
                             ((uVar16 & 0xffffffdf) != 0x58 && (uVar16 & 0xfffffff8) != 0x30))
                          goto LAB_001912ac;
                        }
                        pVVar40 = pcVar42->temp_string;
                        pcVar29 = (c2m_ctx_t)pVVar40->varr;
                        if (pcVar29 == (c2m_ctx_t)0x0) {
                          process_replacement_cold_11();
                          goto LAB_001915b8;
                        }
                        sVar46 = pVVar40->els_num;
                        uVar50 = sVar46 + 1;
                        if (pVVar40->size < uVar50) {
                          sVar54 = (uVar50 >> 1) + uVar50;
                          pcVar43 = pcVar29;
                          pcVar29 = (c2m_ctx_t)realloc(pcVar29,sVar54);
                          pVVar40->varr = (char *)pcVar29;
                          pVVar40->size = sVar54;
                          sVar46 = pVVar40->els_num;
                          uVar50 = sVar46 + 1;
                        }
                        pVVar40->els_num = uVar50;
                        *(char *)((long)pcVar29->env[0].__jmpbuf + (sVar46 - 0x10)) = cVar49;
                        cVar49 = pcVar45[1];
                        pcVar45 = pcVar45 + 1;
                      } while (cVar49 != '\0');
                    }
                  }
                  pMVar23 = (MIR_context_t)((long)&pMVar23->gen_ctx + 1);
                } while (pMVar23 < pcVar44->ctx);
              }
              pVVar40 = pcVar42->temp_string;
              pcVar29 = (c2m_ctx_t)pVVar40->varr;
              if (pcVar29 != (c2m_ctx_t)0x0) {
                sVar46 = pVVar40->els_num;
                uVar50 = sVar46 + 1;
                if (pVVar40->size < uVar50) {
                  pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
                  pcVar44 = pcVar53;
                  pcVar43 = pcVar29;
                  pcVar29 = (c2m_ctx_t)realloc(pcVar29,(size_t)pcVar53);
                  pVVar40->varr = (char *)pcVar29;
                  pVVar40->size = (size_t)pcVar53;
                  sVar46 = pVVar40->els_num;
                  uVar50 = sVar46 + 1;
                }
                pVVar40->els_num = uVar50;
                *(undefined1 *)((long)pcVar29->env[0].__jmpbuf + (sVar46 - 0x10)) = 0x22;
                pVVar40 = pcVar42->temp_string;
                pcVar29 = (c2m_ctx_t)pVVar40->varr;
                if (pcVar29 != (c2m_ctx_t)0x0) {
                  sVar46 = pVVar40->els_num;
                  uVar50 = sVar46 + 1;
                  if (pVVar40->size < uVar50) {
                    pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
                    pcVar44 = pcVar53;
                    pcVar43 = pcVar29;
                    pcVar29 = (c2m_ctx_t)realloc(pcVar29,(size_t)pcVar53);
                    pVVar40->varr = (char *)pcVar29;
                    pVVar40->size = (size_t)pcVar53;
                    sVar46 = pVVar40->els_num;
                    uVar50 = sVar46 + 1;
                  }
                  pVVar40->els_num = uVar50;
                  *(undefined1 *)((long)pcVar29->env[0].__jmpbuf + (sVar46 - 0x10)) = 0;
                  if (pcVar42->temp_string != (VARR_char *)0x0) {
                    sVar58 = uniq_cstr(pcVar42,pcVar42->temp_string->varr);
                    pcVar22->env[0].__jmpbuf[3] = (long)sVar58.s;
                    set_string_val(pcVar42,(token_t)pcVar22,pcVar42->temp_string,0x20);
                    goto LAB_00190f77;
                  }
                  goto LAB_001915fe;
                }
                goto LAB_001915f4;
              }
              goto LAB_001915ef;
            }
            goto LAB_001915e5;
          }
          iVar18 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
          lVar21 = (long)iVar18;
          if (((lVar21 < 2) ||
              ((sVar1 = **(short **)(lVar3 + -0x10 + lVar21 * 8), sVar1 != 0x142 &&
               (((iVar18 == 2 || (sVar1 != 0x20)) ||
                (**(short **)(lVar3 + -0x18 + lVar21 * 8) != 0x142)))))) &&
             (((iVar17 <= iVar18 || (**(short **)(lVar3 + lVar21 * 8) != 0x142)) &&
              ((iVar17 <= iVar18 + 1 ||
               ((**(short **)(lVar3 + (long)(iVar18 + 1) * 8) != 0x142 ||
                (**(short **)(lVar3 + lVar21 * 8) != 0x20)))))))) {
            pcVar45 = (ptVar19->pos).fname;
            iVar17 = (ptVar19->pos).lno;
            iVar18 = (ptVar19->pos).ln_pos;
            ptVar24 = (token_t)reg_malloc(pcVar42,0x30);
            *(undefined4 *)ptVar24 = 0x144;
            (ptVar24->pos).fname = pcVar45;
            (ptVar24->pos).lno = iVar17;
            (ptVar24->pos).ln_pos = iVar18;
            ptVar24->repr = "";
            ptVar24->node_code = N_IGNORE;
            ptVar24->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)pcVar42->buffered_tokens,ptVar24);
            copy_and_push_back(pcVar42,(VARR_token_t *)pcVar44,*(pos_t *)&((c2m_ctx_t)t)->options);
            pcVar45 = (ptVar19->pos).fname;
            iVar17 = (ptVar19->pos).lno;
            iVar18 = (ptVar19->pos).ln_pos;
            ptVar19 = (token_t)reg_malloc(pcVar42,0x30);
            *(undefined4 *)ptVar19 = 0x143;
            (ptVar19->pos).fname = pcVar45;
            (ptVar19->pos).lno = iVar17;
            (ptVar19->pos).ln_pos = iVar18;
            ptVar19->repr = "";
            ptVar19->node_code = N_IGNORE;
            ptVar19->node = (node_t_conflict)0x0;
            unget_next_pptoken((c2m_ctx_t)pcVar42->buffered_tokens,ptVar19);
            return;
          }
          if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_001915c7;
          if (pcVar44->ctx == (MIR_context_t)0x1) {
            pptVar20 = (token_t *)pcVar44->env[0].__jmpbuf[0];
            if (pptVar20 != (token_t *)0x0) {
              sVar1 = *(short *)*pptVar20;
              if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00190f19;
              goto LAB_00190ee0;
            }
            goto LAB_001915d6;
          }
          if (pcVar44->ctx == (MIR_context_t)0x0) {
LAB_00190f19:
            pcVar45 = (ptVar19->pos).fname;
            lVar21 = *(long *)&(ptVar19->pos).lno;
            pcVar22 = (c2m_ctx_t)reg_malloc(pcVar42,0x30);
            *(undefined4 *)&pcVar22->ctx = 0x141;
            ((pos_t *)&pcVar22->options)->fname = pcVar45;
            pcVar22->env[0].__jmpbuf[0] = lVar21;
            pcVar22->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar22->env[0].__jmpbuf + 1) = 0;
            pcVar22->env[0].__jmpbuf[2] = 0;
            goto LAB_00190f77;
          }
LAB_00190ee0:
          pcVar43 = (c2m_ctx_t)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
          add_tokens((VARR_token_t *)pcVar43,(VARR_token_t *)pcVar44);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              puVar5 = (uint *)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
              if (puVar5 == (uint *)0x0) goto LAB_001915ea;
              uStack_94 = *puVar5;
            }
            else {
              uStack_94 = 0xffffffff;
            }
          }
LAB_00190f61:
          pcVar22 = (c2m_ctx_t)copy_token(pcVar42,ptVar19,*(pos_t *)&((c2m_ctx_t)t)->options);
LAB_00190f77:
          pcVar43 = (c2m_ctx_t)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
          add_token((VARR_token_t *)pcVar43,(token_t)pcVar22);
          pcVar44 = pcVar22;
        }
        iVar18 = *(int *)(((c2m_ctx_t)t)->env[0].__jmpbuf + 2);
      } while (iVar18 < iVar17);
    }
    ptVar19 = get_next_pptoken_1(pcVar42,0);
    unget_next_pptoken((c2m_ctx_t)pcVar42->buffered_tokens,ptVar19);
    pcVar45 = (ptVar19->pos).fname;
    iVar17 = (ptVar19->pos).lno;
    iVar18 = (ptVar19->pos).ln_pos;
    ptVar19 = (token_t)reg_malloc(pcVar42,0x30);
    *(undefined4 *)ptVar19 = 0x145;
    (ptVar19->pos).fname = pcVar45;
    (ptVar19->pos).lno = iVar17;
    (ptVar19->pos).ln_pos = iVar18;
    ptVar19->repr = "";
    ptVar19->node_code = N_IGNORE;
    ptVar19->node = (node_t_conflict)0x0;
    unget_next_pptoken((c2m_ctx_t)pcVar42->buffered_tokens,ptVar19);
    pVVar7 = (VARR_token_t *)((c2m_ctx_t)t)->env[0].__jmpbuf[3];
    do_concat(pcVar42,pVVar7);
    push_back(pcVar42,pVVar7);
    pMVar36->func_redef_permission_p = 1;
    return;
  }
LAB_001915e0:
  process_replacement_cold_19();
LAB_001915e5:
  process_replacement_cold_16();
  pcVar44 = pcVar29;
LAB_001915ea:
  process_replacement_cold_1();
LAB_001915ef:
  process_replacement_cold_15();
LAB_001915f4:
  process_replacement_cold_14();
  pcVar29 = pcVar44;
LAB_001915f9:
  pcVar44 = pcVar29;
  process_replacement_cold_17();
LAB_001915fe:
  process_replacement_cold_13();
  pcVar29 = pcVar44;
LAB_00191603:
  process_replacement_cold_5();
LAB_00191608:
  process_replacement_cold_6();
  pcVar44 = pcVar43;
LAB_0019160d:
  process_replacement_cold_4();
  ppVar8 = pcVar44->pre_ctx;
  while( true ) {
    ptVar19 = get_next_pptoken_1(pcVar44,0);
    if ((short)*(uint *)ptVar19 != 0x145) break;
    pop_macro_call((c2m_ctx_t)pcVar44->pre_ctx->macro_call_stack);
  }
  uVar16 = *(uint *)ptVar19 & 0xffff;
  pMVar36 = (MIR_context_t)(ulong)uVar16;
  if ((uVar16 == 10) || (uVar16 == 0x20)) {
    ptVar24 = get_next_pptoken_1(pcVar44,0);
    pMVar36 = (MIR_context_t)(ulong)*(ushort *)ptVar24;
    t_01 = ptVar19;
  }
  else {
    t_01 = (token_t)0x0;
    ptVar24 = ptVar19;
  }
  if ((int)pMVar36 != 0x28) {
    unget_next_pptoken((c2m_ctx_t)pcVar44->buffered_tokens,ptVar24);
    if (t_01 != (token_t)0x0) {
      unget_next_pptoken((c2m_ctx_t)pcVar44->buffered_tokens,t_01);
    }
    out_token(pcVar44,t_00);
    return;
  }
  pcVar42 = (c2m_ctx_t)(t_00->pos).fname;
  pmVar25 = new_macro_call((macro_t)pcVar29,t_00->pos);
  pmVar9 = pmVar25->macro;
  pcVar43 = (c2m_ctx_t)&DAT_00000018;
  pVVar26 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar26 == (VARR_token_arr_t *)0x0) {
LAB_00191caf:
    mir_varr_error((char *)pcVar43);
  }
  pVVar26->els_num = 0;
  pVVar26->size = 0x10;
  pcStack_f0 = (c2m_ctx_t)malloc(0x80);
  pcVar43 = (c2m_ctx_t)&DAT_00000018;
  pVVar26->varr = (token_arr_t *)pcStack_f0;
  puVar27 = (ulong *)malloc(0x18);
  if (puVar27 == (ulong *)0x0) goto LAB_00191caf;
  pcVar43 = (c2m_ctx_t)0x80;
  *puVar27 = 0;
  puVar27[1] = 0x10;
  pvVar28 = malloc(0x80);
  puVar27[2] = (ulong)pvVar28;
  pVVar7 = pmVar9->params;
  if (pVVar7 == (VARR_token_t *)0x0) {
LAB_00191cc3:
    try_param_macro_call_cold_16();
LAB_00191cc8:
    try_param_macro_call_cold_14();
    goto LAB_00191ccd;
  }
  pMVar23 = (MIR_context_t)pVVar7->els_num;
  iVar17 = 0;
  bVar56 = false;
  if (pMVar23 != (MIR_context_t)0x1) {
LAB_00191751:
    pMVar47 = (MIR_context_t)0x10;
    bVar57 = false;
    pMStack_110 = (MIR_context_t)0x0;
    pMStack_108 = (MIR_context_t)0x0;
    pMVar35 = (MIR_context_t)((long)&pMVar23[-1].wrapper_end_addr + 7);
    do {
      pcVar42 = (c2m_ctx_t)0x0;
      pcVar43 = pcVar44;
      pcVar29 = (c2m_ctx_t)get_next_pptoken_1(pcVar44,0);
      uVar2 = *(ushort *)&pcVar29->ctx;
      if (uVar2 == 0x145) {
        pcVar42 = (c2m_ctx_t)0x0;
        pcVar29 = (c2m_ctx_t)get_next_pptoken_1(pcVar44,0);
        pcVar43 = (c2m_ctx_t)pcVar44->pre_ctx->macro_call_stack;
        pop_macro_call(pcVar43);
        uVar2 = *(ushort *)&pcVar29->ctx;
      }
      uVar16 = (uint)uVar2;
      uVar38 = uVar16 * 0x10000 + 0xfec30000 >> 0x10;
      if (((uVar38 < 0xb) && (pcVar42 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar38 & 0x1f) & 1) != 0)) ||
         (pMVar36 = (MIR_context_t)(ulong)CONCAT31((int3)(uVar16 * 0x10000 >> 8),uVar16 == 0x23),
         (bool)(bVar57 & uVar16 == 0x23))) {
LAB_001919f1:
        if (uVar16 != 0x29) {
          in_R8 = (char **)pmVar9->id->repr;
          error(pcVar44,0x1c19de,(char *)pcVar29->options,pcVar29->env[0].__jmpbuf[0]);
          pcVar43 = (c2m_ctx_t)pcVar44->buffered_tokens;
          pcVar42 = pcVar29;
          unget_next_pptoken(pcVar43,(token_t)pcVar29);
        }
        pMVar36 = pMStack_110;
        if (pcStack_f0 == (c2m_ctx_t)0x0) goto LAB_00191cc8;
        pMVar35 = (MIR_context_t)((long)&pMStack_110->gen_ctx + 1);
        if (pMVar47 < pMVar35) {
          pMVar47 = (MIR_context_t)((long)&pMVar35->gen_ctx + ((ulong)pMVar35 >> 1));
          pcVar42 = (c2m_ctx_t)((long)pMVar47 * 8);
          pcVar43 = pcStack_f0;
          pcStack_f0 = (c2m_ctx_t)realloc(pcStack_f0,(size_t)pcVar42);
          pVVar26->varr = (token_arr_t *)pcStack_f0;
          pVVar26->size = (size_t)pMVar47;
          pMVar35 = (MIR_context_t)((long)&((MIR_context_t)pVVar26->els_num)->gen_ctx + 1);
          pMVar36 = (MIR_context_t)pVVar26->els_num;
        }
        pVVar26->els_num = (size_t)pMVar35;
        pcStack_f0->env[0].__jmpbuf[(long)((long)&pMVar36[-1].wrapper_end_addr + 6)] = (long)puVar27
        ;
        if ((pMVar23 == (MIR_context_t)0x0) && (pMVar35 == (MIR_context_t)0x1)) {
          if (pVVar26->varr == (token_arr_t *)0x0) goto LAB_00191cdc;
          pcVar22 = (c2m_ctx_t)*pVVar26->varr;
          if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_00191ce1;
          if (pcVar22->ctx == (MIR_context_t)0x0) {
            pcVar43 = (c2m_ctx_t)pcVar22->env[0].__jmpbuf[0];
            pVVar26->els_num = 0;
            if (pcVar43 == (c2m_ctx_t)0x0) goto LAB_00191cfa;
LAB_00191c30:
            free(pcVar43);
            free(pcVar22);
            pcVar43 = pcVar22;
            goto LAB_00191c3d;
          }
          if (pcVar22->ctx == (MIR_context_t)0x1) {
            pcVar43 = (c2m_ctx_t)pcVar22->env[0].__jmpbuf[0];
            if (pcVar43 == (c2m_ctx_t)0x0) goto LAB_00191cf5;
            if (*(short *)&pcVar43->ctx->gen_ctx == 0x20) {
              pVVar26->els_num = 0;
              goto LAB_00191c30;
            }
          }
        }
        if (pMVar35 <= pMVar23) {
          if (pMVar23 <= pMVar35) goto LAB_00191c3d;
          pMStack_128 = (MIR_context_t)0x1c1a1d;
          goto LAB_00191b75;
        }
        ppVVar31 = pVVar26->varr;
        if (ppVVar31 == (token_arr_t *)0x0) goto LAB_00191ce6;
        pVVar30 = ppVVar31[(long)pMVar23];
        if (pVVar30 == (token_arr_t)0x0) goto LAB_00191ceb;
        if (pVVar30->els_num != 0) {
          if (pVVar30->varr == (token_t *)0x0) goto LAB_00191cf0;
          pcVar29 = (c2m_ctx_t)*pVVar30->varr;
        }
        pMStack_128 = (MIR_context_t)0x1c19fa;
        goto LAB_00191b23;
      }
      if (iVar17 == 0) {
        if (uVar16 == 0x29) goto LAB_001919f1;
        if ((bVar56) || (uVar16 != 0x2c)) goto LAB_001917fe;
        if (pcStack_f0 == (c2m_ctx_t)0x0) goto LAB_00191cd2;
        pMVar51 = (MIR_context_t)((long)&pMStack_108->gen_ctx + 1);
        pMVar36 = pMStack_108;
        pMStack_108 = pMVar51;
        if (pMVar47 < pMVar51) {
          pMVar47 = (MIR_context_t)((long)&pMVar51->gen_ctx + ((ulong)pMVar51 >> 1));
          pcVar42 = (c2m_ctx_t)((long)pMVar47 * 8);
          pcStack_f0 = (c2m_ctx_t)realloc(pcStack_f0,(size_t)pcVar42);
          pVVar26->varr = (token_arr_t *)pcStack_f0;
          pVVar26->size = (size_t)pMVar47;
          pMVar36 = (MIR_context_t)pVVar26->els_num;
          pMStack_108 = (MIR_context_t)((long)&pMVar36->gen_ctx + 1);
        }
        pcVar43 = (c2m_ctx_t)&DAT_00000018;
        pVVar26->els_num = (size_t)pMStack_108;
        pcStack_f0->env[0].__jmpbuf[(long)((long)&pMVar36[-1].wrapper_end_addr + 6)] = (long)puVar27
        ;
        puVar27 = (ulong *)malloc(0x18);
        if (puVar27 == (ulong *)0x0) goto LAB_00191caf;
        pcVar43 = (c2m_ctx_t)0x80;
        *puVar27 = 0;
        puVar27[1] = 0x10;
        pvVar28 = malloc(0x80);
        puVar27[2] = (ulong)pvVar28;
        iVar17 = 0;
        if (pMStack_108 == pMVar35) {
          pVVar7 = pmVar9->params;
          if (((pVVar7 == (VARR_token_t *)0x0) ||
              (pMVar36 = (MIR_context_t)pVVar7->varr, pMVar36 == (MIR_context_t)0x0)) ||
             ((MIR_context_t)pVVar7->els_num <= pMVar35)) goto LAB_00191cbe;
          iVar18 = strcmp(*(char **)(*(long *)((long)pMVar36 + (long)pMVar23 * 8 + -8) + 0x28),"..."
                         );
          bVar56 = iVar18 == 0;
          pMStack_108 = pMVar35;
          pMStack_110 = pMVar35;
        }
        else {
          bVar56 = false;
          pMStack_110 = pMStack_108;
        }
      }
      else {
LAB_001917fe:
        pvVar28 = (void *)puVar27[2];
        if (pvVar28 == (void *)0x0) goto LAB_00191cb9;
        uVar39 = *puVar27;
        uVar50 = uVar39 + 1;
        if (puVar27[1] < uVar50) {
          uVar50 = (uVar50 >> 1) + uVar50;
          pvVar28 = realloc(pvVar28,uVar50 * 8);
          puVar27[2] = (ulong)pvVar28;
          puVar27[1] = uVar50;
          uVar39 = *puVar27;
          uVar50 = uVar39 + 1;
        }
        *puVar27 = uVar50;
        *(c2m_ctx_t *)((long)pvVar28 + uVar39 * 8) = pcVar29;
        if (*(short *)&pcVar29->ctx == 0x28) {
          iVar17 = iVar17 + 1;
        }
        else if (*(short *)&pcVar29->ctx == 0x29) {
          iVar17 = iVar17 + -1;
        }
      }
      bVar57 = *(short *)&pcVar29->ctx == 10;
    } while( true );
  }
  if (pVVar7->varr != (token_t *)0x0) {
    bVar56 = *(short *)*pVVar7->varr == 0x10f;
    goto LAB_00191751;
  }
  goto LAB_00191cd7;
LAB_00191b75:
  pMVar51 = (MIR_context_t)((long)&pMVar35->gen_ctx + 1);
  pcVar43 = (c2m_ctx_t)&DAT_00000018;
  pVVar30 = (token_arr_t)malloc(0x18);
  if (pVVar30 != (token_arr_t)0x0) {
    pcVar43 = (c2m_ctx_t)0x80;
    pVVar30->els_num = 0;
    pVVar30->size = 0x10;
    pptVar20 = (token_t *)malloc(0x80);
    pVVar30->varr = pptVar20;
    ppVVar31 = pVVar26->varr;
    if (ppVVar31 != (token_arr_t *)0x0) goto code_r0x00191bb5;
    try_param_macro_call_cold_6();
LAB_00191cb9:
    try_param_macro_call_cold_1();
LAB_00191cbe:
    try_param_macro_call_cold_2();
    goto LAB_00191cc3;
  }
  goto LAB_00191caf;
code_r0x00191bb5:
  pMVar36 = pMVar35;
  if (pMVar47 <= pMVar35) {
    pMVar47 = (MIR_context_t)((long)&pMVar51->gen_ctx + ((ulong)pMVar51 >> 1));
    pcVar42 = (c2m_ctx_t)((long)pMVar47 * 8);
    ppVVar31 = (token_arr_t *)realloc(ppVVar31,(size_t)pcVar42);
    pVVar26->varr = ppVVar31;
    pVVar26->size = (size_t)pMVar47;
  }
  pVVar26->els_num = (size_t)pMVar51;
  ppVVar31[(long)pMVar35] = pVVar30;
  pMVar35 = pMVar51;
  if (pMVar23 <= pMVar51) goto LAB_00191bf5;
  goto LAB_00191b75;
  while( true ) {
    pcVar52 = (c2m_ctx_t)((long)&pcVar52[-1].gen_ctx + 7);
    pcVar53 = (c2m_ctx_t)(((__jmp_buf_tag *)pcVar53)->__jmpbuf + 1);
    if (pcVar44 == pcVar52) break;
LAB_00191dfe:
    pcVar29 = (c2m_ctx_t)((__jmp_buf_tag *)pcVar53)->__jmpbuf[0];
    if (*(int *)(pcVar29->env[0].__jmpbuf + 1) == 0x19) {
      pVVar40 = pcVar43->symbol_text;
      if ((pVVar40 == (VARR_char *)0x0) ||
         (pcVar22 = (c2m_ctx_t)pVVar40->varr, pcVar22 == (c2m_ctx_t)0x0)) goto LAB_00192256;
      pVVar40->els_num = 0;
      pVVar11 = pcVar43->temp_string;
      if ((pVVar11 == (VARR_char *)0x0) || (pVVar11->varr == (char *)0x0)) goto LAB_0019225b;
      pVVar11->els_num = 0;
      pcVar29 = (c2m_ctx_t)pVVar40->els_num;
      puVar37 = (undefined1 *)((long)&pcVar29->ctx + 1);
      if ((undefined1 *)pVVar40->size < puVar37) {
        pcVar44 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)(puVar37 + ((ulong)puVar37 >> 1)));
        pVVar40->varr = (char *)pcVar22;
        pVVar40->size = (size_t)(puVar37 + ((ulong)puVar37 >> 1));
        pcVar29 = (c2m_ctx_t)pVVar40->els_num;
        puVar37 = (undefined1 *)((long)&pcVar29->ctx + 1);
      }
      pVVar40->els_num = (size_t)puVar37;
      *(undefined1 *)((long)pcVar29->env[0].__saved_mask.__val + (long)(pcVar22->env + -1) + 0x60) =
           0x3c;
      if (pcVar48 < (c2m_ctx_t)((long)pcVar41 - (long)pcVar52)) goto LAB_00191f68;
      goto LAB_0019205a;
    }
  }
LAB_00191e17:
  if (pcVar22 != (c2m_ctx_t)0x0) goto LAB_00191e1c;
  goto LAB_00191e37;
LAB_00191f68:
  do {
    pptVar12 = (token_t *)pcVar42->env[0].__jmpbuf[0];
    if ((pptVar12 == (token_t *)0x0) || ((c2m_ctx_t)pcVar42->ctx <= pcVar48)) {
LAB_0019223d:
      get_header_name_cold_9();
      goto LAB_00192242;
    }
    pcVar45 = pptVar12[(long)pcVar48]->repr;
    cVar49 = *pcVar45;
    while (cVar49 != '\0') {
      pVVar40 = pcVar43->symbol_text;
      pcVar22 = (c2m_ctx_t)pVVar40->varr;
      if (pcVar22 == (c2m_ctx_t)0x0) {
LAB_00192238:
        get_header_name_cold_2();
        goto LAB_0019223d;
      }
      sVar46 = pVVar40->els_num;
      uVar50 = sVar46 + 1;
      if (pVVar40->size < uVar50) {
        pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
        pcVar29 = pcVar53;
        pcVar44 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar53);
        pVVar40->varr = (char *)pcVar22;
        pVVar40->size = (size_t)pcVar53;
        sVar46 = pVVar40->els_num;
        uVar50 = sVar46 + 1;
      }
      pVVar40->els_num = uVar50;
      *(char *)((long)pcVar22->env[0].__jmpbuf + (sVar46 - 0x10)) = cVar49;
      pVVar40 = pcVar43->temp_string;
      pcVar22 = (c2m_ctx_t)pVVar40->varr;
      if (pcVar22 == (c2m_ctx_t)0x0) {
        get_header_name_cold_1();
        goto LAB_00192238;
      }
      sVar46 = pVVar40->els_num;
      cVar49 = *pcVar45;
      uVar50 = sVar46 + 1;
      if (pVVar40->size < uVar50) {
        pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
        pcVar29 = pcVar53;
        pcVar44 = pcVar22;
        pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar53);
        pVVar40->varr = (char *)pcVar22;
        pVVar40->size = (size_t)pcVar53;
        sVar46 = pVVar40->els_num;
        uVar50 = sVar46 + 1;
      }
      pVVar40->els_num = uVar50;
      *(char *)((long)pcVar22->env[0].__jmpbuf + (sVar46 - 0x10)) = cVar49;
      cVar49 = pcVar45[1];
      pcVar45 = pcVar45 + 1;
    }
    pcVar48 = (c2m_ctx_t)((long)&pcVar48->ctx + 1);
  } while ((c2m_ctx_t)((long)pcVar41 - (long)pcVar52) != pcVar48);
LAB_0019205a:
  pVVar40 = pcVar43->symbol_text;
  pcVar22 = (c2m_ctx_t)pVVar40->varr;
  if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_00192265;
  sVar46 = pVVar40->els_num;
  uVar50 = sVar46 + 1;
  if (pVVar40->size < uVar50) {
    pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
    pcVar29 = pcVar53;
    pcVar44 = pcVar22;
    pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar53);
    pVVar40->varr = (char *)pcVar22;
    pVVar40->size = (size_t)pcVar53;
    sVar46 = pVVar40->els_num;
    uVar50 = sVar46 + 1;
  }
  pVVar40->els_num = uVar50;
  *(undefined1 *)((long)pcVar22->env[0].__jmpbuf + (sVar46 - 0x10)) = 0x3e;
  pVVar40 = pcVar43->symbol_text;
  pcVar22 = (c2m_ctx_t)pVVar40->varr;
  if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_0019226a;
  sVar46 = pVVar40->els_num;
  uVar50 = sVar46 + 1;
  if (pVVar40->size < uVar50) {
    pcVar53 = (c2m_ctx_t)((uVar50 >> 1) + uVar50);
    pcVar29 = pcVar53;
    pcVar44 = pcVar22;
    pcVar22 = (c2m_ctx_t)realloc(pcVar22,(size_t)pcVar53);
    pVVar40->varr = (char *)pcVar22;
    pVVar40->size = (size_t)pcVar53;
    sVar46 = pVVar40->els_num;
    uVar50 = sVar46 + 1;
  }
  pVVar40->els_num = uVar50;
  *(undefined1 *)((long)pcVar22->env[0].__jmpbuf + (sVar46 - 0x10)) = 0;
  pVVar40 = pcVar43->temp_string;
  pcVar45 = pVVar40->varr;
  if (pcVar45 == (char *)0x0) goto LAB_0019226f;
  sVar46 = pVVar40->els_num;
  uVar50 = sVar46 + 1;
  if (pVVar40->size < uVar50) {
    sVar54 = (uVar50 >> 1) + uVar50;
    pcVar45 = (char *)realloc(pcVar45,sVar54);
    pVVar40->varr = pcVar45;
    pVVar40->size = sVar54;
    sVar46 = pVVar40->els_num;
    uVar50 = sVar46 + 1;
  }
  pVVar40->els_num = uVar50;
  pcVar45[sVar46] = '\0';
  pcVar29 = (c2m_ctx_t)((ulong)pcVar41 & 0xffffffff);
  pcVar44 = pcVar42;
  del_tokens((VARR_token_t *)pcVar42,(int)pcVar41,-(int)pcVar52);
  if (pcVar43->symbol_text != (VARR_char *)0x0) {
    if (pcVar43->temp_string == (VARR_char *)0x0) goto LAB_00192279;
    pcVar45 = pcVar43->symbol_text->varr;
    sVar58 = uniq_cstr(pcVar43,pcVar43->temp_string->varr);
    pnVar32 = new_node(pcVar43,N_STR);
    add_pos(pcVar43,pnVar32,pVar13);
    (pnVar32->u).s = sVar58;
    sVar58 = uniq_cstr(pcVar43,pcVar45);
    pcVar29 = (c2m_ctx_t)0x30;
    pcVar44 = pcVar43;
    ptVar19 = (token_t)reg_malloc(pcVar43,0x30);
    *(undefined4 *)ptVar19 = 0x13e;
    (ptVar19->pos).fname = (char *)pcVar55;
    *(token_t **)&(ptVar19->pos).lno = pptVar20;
    ptVar19->repr = sVar58.s;
    ptVar19->node_code = N_IGNORE;
    ptVar19->node = pnVar32;
    pptVar20 = (token_t *)pcVar42->env[0].__jmpbuf[0];
    if ((pptVar20 != (token_t *)0x0) && (pcVar22 = (c2m_ctx_t)pcVar42->ctx, pcVar41 < pcVar22)) {
      pptVar20[(long)pcVar41] = ptVar19;
      goto LAB_00191e1c;
    }
    goto LAB_00192260;
  }
  goto LAB_00192274;
  while( true ) {
    free(pcVar43);
    free(pcVar42);
    pcVar43 = pcVar42;
    pMVar35 = pMVar36;
    if (pMVar36 <= pMVar23) break;
LAB_00191b23:
    pMVar36 = (MIR_context_t)((long)&pMVar35[-1].wrapper_end_addr + 7);
    pVVar26->els_num = (size_t)pMVar36;
    pcVar42 = (c2m_ctx_t)ppVVar31[(long)((long)&pMVar35[-1].wrapper_end_addr + 7)];
    if ((pcVar42 == (c2m_ctx_t)0x0) ||
       (pcVar43 = (c2m_ctx_t)pcVar42->env[0].__jmpbuf[0], pcVar43 == (c2m_ctx_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00191caf;
    }
  }
LAB_00191bf5:
  pcVar42 = (c2m_ctx_t)((pos_t *)&pcVar29->options)->fname;
  in_R8 = (char **)pmVar9->id->repr;
  error(pcVar44,pMStack_128,(char *)pcVar42,pcVar29->env[0].__jmpbuf[0]);
  pMVar36 = pMStack_128;
  pcVar43 = pcVar44;
LAB_00191c3d:
  pmVar25->args = pVVar26;
  pVVar10 = ppVar8->macro_call_stack;
  __ptr = pVVar10->varr;
  if (__ptr != (macro_call_t *)0x0) {
    sVar46 = pVVar10->els_num;
    uVar50 = sVar46 + 1;
    if (pVVar10->size < uVar50) {
      sVar46 = (uVar50 >> 1) + uVar50;
      __ptr = (macro_call_t *)realloc(__ptr,sVar46 * 8);
      pVVar10->varr = __ptr;
      pVVar10->size = sVar46;
      sVar46 = pVVar10->els_num;
      uVar50 = sVar46 + 1;
    }
    pVVar10->els_num = uVar50;
    __ptr[sVar46] = pmVar25;
    return;
  }
LAB_00191ccd:
  try_param_macro_call_cold_8();
LAB_00191cd2:
  try_param_macro_call_cold_3();
LAB_00191cd7:
  try_param_macro_call_cold_15();
LAB_00191cdc:
  try_param_macro_call_cold_13();
LAB_00191ce1:
  try_param_macro_call_cold_12();
LAB_00191ce6:
  try_param_macro_call_cold_11();
LAB_00191ceb:
  try_param_macro_call_cold_10();
LAB_00191cf0:
  try_param_macro_call_cold_7();
LAB_00191cf5:
  try_param_macro_call_cold_4();
LAB_00191cfa:
  try_param_macro_call_cold_5();
  pvVar28 = (void *)pcVar43->env[0].__jmpbuf[0];
  if (pvVar28 != (void *)0x0) {
    pMVar23 = pcVar43->ctx;
    pMVar36 = (MIR_context_t)((long)&pMVar23->gen_ctx + 1);
    if ((MIR_context_t)pcVar43->options < pMVar36) {
      pcVar55 = (c2mir_options *)((long)&pMVar36->gen_ctx + ((ulong)pMVar36 >> 1));
      pvVar28 = realloc(pvVar28,(long)pcVar55 * 8);
      pcVar43->env[0].__jmpbuf[0] = (long)pvVar28;
      pcVar43->options = pcVar55;
      pMVar23 = pcVar43->ctx;
      pMVar36 = (MIR_context_t)((long)&pMVar23->gen_ctx + 1);
    }
    pcVar43->ctx = pMVar36;
    *(c2m_ctx_t *)((long)pvVar28 + (long)pMVar23 * 8) = pcVar42;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar43 != (c2m_ctx_t)0x0) && (pcVar43->env[0].__jmpbuf[0] != 0)) &&
     (pMVar36 = pcVar43->ctx, pMVar36 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar29 = pcVar42;
  pcVar44 = pcVar43;
  if (pcVar42 == (c2m_ctx_t)0x0) {
LAB_00192242:
    get_header_name_cold_15();
LAB_00192247:
    get_header_name_cold_13();
LAB_0019224c:
    get_header_name_cold_12();
  }
  else {
    pcVar22 = (c2m_ctx_t)pcVar42->ctx;
    if (pcVar22 != (c2m_ctx_t)0x0) {
      pcVar44 = (c2m_ctx_t)pcVar42->env[0].__jmpbuf[0];
      if (pcVar44 == (c2m_ctx_t)0x0) goto LAB_00192247;
      pcVar41 = (c2m_ctx_t)0x0;
      pcVar53 = pcVar44;
      do {
        pcVar53 = (c2m_ctx_t)&pcVar53->options;
        pcVar29 = (c2m_ctx_t)pcVar44->env[0].__jmpbuf[(long)((long)&pcVar41[-1].gen_ctx + 6)];
        if (*(short *)&pcVar29->ctx != 0x20) {
          if ((*(int *)(pcVar29->env[0].__jmpbuf + 1) != 0x17) ||
             (pcVar48 = (c2m_ctx_t)((long)&pcVar41->ctx + 1), pcVar22 <= pcVar48))
          goto LAB_00191e17;
          pcVar55 = pcVar29->options;
          pptVar20 = (token_t *)pcVar29->env[0].__jmpbuf[0];
          pVar13 = *(pos_t *)&pcVar29->options;
          pcVar44 = (c2m_ctx_t)((long)pcVar41 - (long)pcVar22);
          pcVar52 = (c2m_ctx_t)0xffffffffffffffff;
          goto LAB_00191dfe;
        }
        pcVar41 = (c2m_ctx_t)((long)&pcVar41->ctx + 1);
      } while (pcVar41 != pcVar22);
LAB_00191e1c:
      pptVar20 = (token_t *)pcVar42->env[0].__jmpbuf[0];
      if (pptVar20 != (token_t *)0x0) {
        pcVar53 = (c2m_ctx_t)(ulong)(*(short *)*pptVar20 == 0x20);
        goto LAB_00191e3b;
      }
      goto LAB_0019224c;
    }
LAB_00191e37:
    pcVar22 = (c2m_ctx_t)0x0;
    pcVar53 = (c2m_ctx_t)0x0;
LAB_00191e3b:
    pcVar29 = (c2m_ctx_t)((long)&pcVar22[-1].gen_ctx + 7);
    if (pcVar53 != pcVar29) {
LAB_00191e88:
      error(pcVar43,0x1c1443,format,pMVar36);
      return;
    }
    if ((pcVar53 < pcVar22) &&
       (pptVar20 = (token_t *)pcVar42->env[0].__jmpbuf[0], pptVar20 != (token_t *)0x0)) {
      ptVar19 = pptVar20[(long)pcVar53];
      sVar1 = *(short *)ptVar19;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar43,ptVar19,in_R8);
        return;
      }
      goto LAB_00191e88;
    }
  }
  get_header_name_cold_14();
LAB_00192256:
  get_header_name_cold_11();
LAB_0019225b:
  get_header_name_cold_10();
LAB_00192260:
  get_header_name_cold_3();
LAB_00192265:
  get_header_name_cold_8();
LAB_0019226a:
  get_header_name_cold_7();
LAB_0019226f:
  get_header_name_cold_6();
LAB_00192274:
  get_header_name_cold_5();
LAB_00192279:
  get_header_name_cold_4();
  plVar33 = (long *)malloc(0x30);
  pcVar45 = &DAT_00000018;
  *plVar33 = (long)pcVar44;
  plVar33[1] = (long)pcVar29;
  plVar33[2] = extraout_RDX;
  *(undefined4 *)(plVar33 + 4) = 0;
  plVar33[3] = 0;
  puVar34 = (undefined8 *)malloc(0x18);
  plVar33[5] = (long)puVar34;
  if (puVar34 == (undefined8 *)0x0) {
    mir_varr_error(pcVar45);
  }
  *puVar34 = 0;
  puVar34[1] = 0x40;
  pvVar28 = malloc(0x200);
  puVar34[2] = pvVar28;
  return;
}

Assistant:

static void skip_nl (c2m_ctx_t c2m_ctx, token_t t,
                     VARR (token_t) * buffer) { /* skip until new line */
  if (t == NULL) t = get_next_pptoken (c2m_ctx);
  for (; t->code != '\n' && t->code != T_EOU; t = get_next_pptoken (c2m_ctx))  // ??>
    if (buffer != NULL) VARR_PUSH (token_t, buffer, t);
  unget_next_pptoken (c2m_ctx, t);
}